

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_misc.cpp
# Opt level: O2

string * log_info<char[1]>(string *__return_storage_ptr__,char (*what) [1],level_enum logger_level)

{
  shared_ptr<spdlog::sinks::ostream_sink<std::mutex>_> oss_sink;
  logger oss_logger;
  ostringstream oss;
  string local_280;
  __shared_ptr<spdlog::sinks::ostream_sink<std::mutex>,_(__gnu_cxx::_Lock_policy)2> local_260;
  allocator local_250 [32];
  __shared_ptr<spdlog::sinks::sink,(__gnu_cxx::_Lock_policy)2> local_230 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  logger local_220;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::make_shared<spdlog::sinks::ostream_sink<std::mutex>,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_260)
  ;
  std::__cxx11::string::string((string *)&local_280,"oss",local_250);
  std::__shared_ptr<spdlog::sinks::sink,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<spdlog::sinks::ostream_sink<std::mutex>,void>(local_230,&local_260);
  spdlog::logger::logger(&local_220,&local_280,(sink_ptr *)local_230);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_228);
  std::__cxx11::string::~string((string *)&local_280);
  LOCK();
  UNLOCK();
  local_220._level.super___atomic_base<int>._M_i =
       (__atomic_base<int>)(__atomic_base<int>)logger_level;
  std::__cxx11::string::string((string *)&local_280,"%v",local_250);
  (*local_220._vptr_logger[6])(&local_220,&local_280,0);
  std::__cxx11::string::~string((string *)&local_280);
  spdlog::logger::info<char[1]>(&local_220,what);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_280);
  std::__cxx11::string::~string((string *)local_250);
  std::__cxx11::string::~string((string *)&local_280);
  spdlog::logger::~logger(&local_220);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_260._M_refcount);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string log_info(const T &what, spdlog::level::level_enum logger_level = spdlog::level::info)
{

    std::ostringstream oss;
    auto oss_sink = std::make_shared<spdlog::sinks::ostream_sink_mt>(oss);

    spdlog::logger oss_logger("oss", oss_sink);
    oss_logger.set_level(logger_level);
    oss_logger.set_pattern("%v");
    oss_logger.info(what);

    return oss.str().substr(0, oss.str().length() - strlen(spdlog::details::os::default_eol));
}